

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O2

CURLcode imap_perform_upgrade_tls(connectdata *conn)

{
  _Bool *done;
  undefined1 *puVar1;
  CURLcode CVar2;
  
  done = &(conn->proto).imapc.ssldone;
  CVar2 = Curl_ssl_connect_nonblocking(conn,0,done);
  if (CVar2 == CURLE_OK) {
    if ((conn->proto).imapc.state != IMAP_UPGRADETLS) {
      (conn->proto).imapc.state = IMAP_UPGRADETLS;
    }
    CVar2 = CURLE_OK;
    if (*done == true) {
      conn->handler = &Curl_handler_imaps;
      puVar1 = &(conn->bits).field_0x8;
      *puVar1 = *puVar1 | 1;
      CVar2 = imap_perform_capability(conn);
      return CVar2;
    }
  }
  return CVar2;
}

Assistant:

static CURLcode imap_perform_upgrade_tls(struct connectdata *conn)
{
  /* Start the SSL connection */
  struct imap_conn *imapc = &conn->proto.imapc;
  CURLcode result = Curl_ssl_connect_nonblocking(conn, FIRSTSOCKET,
                                                 &imapc->ssldone);

  if(!result) {
    if(imapc->state != IMAP_UPGRADETLS)
      state(conn, IMAP_UPGRADETLS);

    if(imapc->ssldone) {
      imap_to_imaps(conn);
      result = imap_perform_capability(conn);
    }
  }

  return result;
}